

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NonLocalBCImpl.H
# Opt level: O2

int __thiscall amrex::NonLocalBC::PolarFn2::j_index(PolarFn2 *this,int j)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = this->Ly;
  if (j < 0) {
    iVar1 = 2;
  }
  else {
    if (j < (int)uVar2) {
      uVar2 = uVar2 >> 1;
      if ((uint)j < uVar2) {
        return j - uVar2;
      }
      return uVar2 + j;
    }
    iVar1 = -2;
  }
  return (int)uVar2 / iVar1 + j;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    int j_index (int j) const noexcept {
        if (j < 0) {
            return j+Ly/2;
        } else if (j >= Ly) {
            return j-Ly/2;
        } else if (j < Ly/2) {
            return j-Ly/2;
        } else {
            return j+Ly/2;
        }
    }